

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QCursor>::copyAppend
          (QGenericArrayOps<QCursor> *this,QCursor *b,QCursor *e)

{
  qsizetype *pqVar1;
  QCursor *pQVar2;
  
  if (b != e) {
    pQVar2 = (this->super_QArrayDataPointer<QCursor>).ptr;
    for (; b < e; b = b + 1) {
      QCursor::QCursor(pQVar2 + (this->super_QArrayDataPointer<QCursor>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<QCursor>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }